

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorBuilder::ValidateQualifiedName(DescriptorBuilder *this,string *name)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  size_type sVar4;
  
  sVar4 = 0;
  bVar2 = false;
  do {
    if (name->_M_string_length == sVar4) {
      return (bool)((bVar2 ^ 1U) & name->_M_string_length != 0);
    }
    bVar1 = (name->_M_dataplus)._M_p[sVar4];
    if ((char)bVar1 < 'a') {
      if ((char)bVar1 < 'A') {
        if ((char)bVar1 < '0') {
          if ((bVar1 != 0x2e) || (bVar3 = true, bVar2)) {
            return false;
          }
        }
        else {
          bVar3 = false;
          if (0x39 < bVar1) {
            return false;
          }
        }
      }
      else {
        bVar3 = false;
        if (bVar1 != 0x5f && 0x5a < bVar1) {
          return false;
        }
      }
    }
    else {
      bVar3 = false;
      if (0x7a < bVar1) {
        return false;
      }
    }
    bVar2 = bVar3;
    sVar4 = sVar4 + 1;
  } while( true );
}

Assistant:

bool DescriptorBuilder::ValidateQualifiedName(const string& name) {
  bool last_was_period = false;

  for (int i = 0; i < name.size(); i++) {
    // I don't trust isalnum() due to locales.  :(
    if (('a' <= name[i] && name[i] <= 'z') ||
        ('A' <= name[i] && name[i] <= 'Z') ||
        ('0' <= name[i] && name[i] <= '9') ||
        (name[i] == '_')) {
      last_was_period = false;
    } else if (name[i] == '.') {
      if (last_was_period) return false;
      last_was_period = true;
    } else {
      return false;
    }
  }

  return !name.empty() && !last_was_period;
}